

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsTableBreakingSettingsDialog.cpp
# Opt level: O2

int __thiscall
KDReports::TableBreakingSettingsDialog::qt_metacall
          (TableBreakingSettingsDialog *this,Call _c,int _id,void **_a)

{
  uint uVar1;
  undefined4 in_register_00000014;
  TableBreakingSettingsDialog *_t;
  
  uVar1 = QDialog::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < (int)uVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (uVar1 < 2) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return uVar1;
      }
      if (uVar1 < 2) {
        (**(code **)(*(long *)this + 0x1b8 + (ulong)(uVar1 != 0) * 8))(this);
      }
    }
    uVar1 = uVar1 - 2;
  }
  return uVar1;
}

Assistant:

int KDReports::TableBreakingSettingsDialog::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}